

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O2

void __thiscall
Diligent::RenderPassBase<Diligent::EngineVkImplTraits>::ReserveSpace
          (RenderPassBase<Diligent::EngineVkImplTraits> *this,RenderPassDesc *Desc,
          FixedLinearAllocator *MemPool)

{
  SubpassDesc *pSVar1;
  long lVar2;
  Uint32 subpass;
  ulong uVar3;
  
  FixedLinearAllocator::AddSpace<Diligent::RESOURCE_STATE>
            (MemPool,(ulong)Desc->SubpassCount * (ulong)Desc->AttachmentCount);
  FixedLinearAllocator::AddSpace<std::pair<unsigned_int,unsigned_int>>
            (MemPool,(ulong)Desc->AttachmentCount);
  FixedLinearAllocator::AddSpace<Diligent::RenderPassAttachmentDesc>
            (MemPool,(ulong)Desc->AttachmentCount);
  FixedLinearAllocator::AddSpace<Diligent::SubpassDesc>(MemPool,(ulong)Desc->SubpassCount);
  lVar2 = 0x40;
  for (uVar3 = 0; uVar3 < Desc->SubpassCount; uVar3 = uVar3 + 1) {
    pSVar1 = Desc->pSubpasses;
    FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>
              (MemPool,(ulong)*(uint *)((long)pSVar1 + lVar2 + -0x40));
    FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>
              (MemPool,(ulong)*(uint *)((long)pSVar1 + lVar2 + -0x30));
    if (*(long *)((long)pSVar1 + lVar2 + -0x20) != 0) {
      FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>
                (MemPool,(ulong)*(uint *)((long)pSVar1 + lVar2 + -0x30));
    }
    if (*(long *)((long)pSVar1 + lVar2 + -0x18) != 0) {
      FixedLinearAllocator::AddSpace<Diligent::AttachmentReference>(MemPool,1);
    }
    FixedLinearAllocator::AddSpace<unsigned_int>
              (MemPool,(ulong)*(uint *)((long)pSVar1 + lVar2 + -0x10));
    if (*(long *)((long)&pSVar1->InputAttachmentCount + lVar2) != 0) {
      FixedLinearAllocator::AddSpace<Diligent::ShadingRateAttachment>(MemPool,1);
    }
    lVar2 = lVar2 + 0x48;
  }
  FixedLinearAllocator::AddSpace<Diligent::SubpassDependencyDesc>
            (MemPool,(ulong)Desc->DependencyCount);
  return;
}

Assistant:

void ReserveSpace(const RenderPassDesc& Desc, FixedLinearAllocator& MemPool) const
    {
        MemPool.AddSpace<RESOURCE_STATE>(size_t{Desc.AttachmentCount} * size_t{Desc.SubpassCount}); // m_AttachmentStates
        MemPool.AddSpace<std::pair<Uint32, Uint32>>(Desc.AttachmentCount);                          // m_AttachmentFirstLastUse

        MemPool.AddSpace<RenderPassAttachmentDesc>(Desc.AttachmentCount); // Desc.pAttachments
        MemPool.AddSpace<SubpassDesc>(Desc.SubpassCount);                 // Desc.pSubpasses

        for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
        {
            const SubpassDesc& SrcSubpass = Desc.pSubpasses[subpass];

            MemPool.AddSpace<AttachmentReference>(SrcSubpass.InputAttachmentCount);        // Subpass.pInputAttachments
            MemPool.AddSpace<AttachmentReference>(SrcSubpass.RenderTargetAttachmentCount); // Subpass.pRenderTargetAttachments

            if (SrcSubpass.pResolveAttachments != nullptr)
                MemPool.AddSpace<AttachmentReference>(SrcSubpass.RenderTargetAttachmentCount); // Subpass.pResolveAttachments

            if (SrcSubpass.pDepthStencilAttachment != nullptr)
                MemPool.AddSpace<AttachmentReference>(1); // Subpass.pDepthStencilAttachment

            MemPool.AddSpace<Uint32>(SrcSubpass.PreserveAttachmentCount); // Subpass.pPreserveAttachments

            if (SrcSubpass.pShadingRateAttachment != nullptr)
                MemPool.AddSpace<ShadingRateAttachment>(1); // Subpass.pShadingRateAttachment
        }

        MemPool.AddSpace<SubpassDependencyDesc>(Desc.DependencyCount); // Desc.pDependencies
    }